

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::GetFarPlane(ON_Viewport *this,ON_Plane *far_plane)

{
  bool bVar1;
  bool local_51;
  ON_3dVector local_50;
  ON_3dPoint local_38;
  bool local_19;
  ON_Plane *pOStack_18;
  bool rc;
  ON_Plane *far_plane_local;
  ON_Viewport *this_local;
  
  pOStack_18 = far_plane;
  far_plane_local = (ON_Plane *)this;
  bVar1 = IsValidFrustum(this);
  local_51 = false;
  if (bVar1) {
    local_51 = IsValidCamera(this);
  }
  local_19 = local_51;
  if (local_51 != false) {
    ::operator*(&local_50,this->m_frus_far,&this->m_CamZ);
    ON_3dPoint::operator-(&local_38,&this->m_CamLoc,&local_50);
    (pOStack_18->origin).x = local_38.x;
    (pOStack_18->origin).y = local_38.y;
    (pOStack_18->origin).z = local_38.z;
    (pOStack_18->xaxis).x = (this->m_CamX).x;
    (pOStack_18->xaxis).y = (this->m_CamX).y;
    (pOStack_18->xaxis).z = (this->m_CamX).z;
    (pOStack_18->yaxis).x = (this->m_CamY).x;
    (pOStack_18->yaxis).y = (this->m_CamY).y;
    (pOStack_18->yaxis).z = (this->m_CamY).z;
    (pOStack_18->zaxis).x = (this->m_CamZ).x;
    (pOStack_18->zaxis).y = (this->m_CamZ).y;
    (pOStack_18->zaxis).z = (this->m_CamZ).z;
    ON_Plane::UpdateEquation(pOStack_18);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool ON_Viewport::GetFarPlane( ON_Plane& far_plane ) const
{
  bool rc = IsValidFrustum() && IsValidCamera();
  if ( rc ) 
  {
    far_plane.origin = m_CamLoc - m_frus_far*m_CamZ;
    far_plane.xaxis = m_CamX;
    far_plane.yaxis = m_CamY;
    far_plane.zaxis = m_CamZ;
    far_plane.UpdateEquation();
  }
  return rc;
}